

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

deUint32 deqp::gles3::Functional::getCompatibleColorFormat(RenderTarget *renderTargetInfo)

{
  uint uVar1;
  PixelFormat *pPVar2;
  PixelFormat *pxFmt;
  RenderTarget *renderTargetInfo_local;
  
  pPVar2 = tcu::RenderTarget::getPixelFormat(renderTargetInfo);
  uVar1 = pPVar2->redBits << 0x18 | pPVar2->greenBits << 0x10 | pPVar2->blueBits << 8 |
          pPVar2->alphaBits;
  if (uVar1 == 0x4040404) {
    renderTargetInfo_local._4_4_ = 0x8056;
  }
  else if (uVar1 == 0x5050501) {
    renderTargetInfo_local._4_4_ = 0x8057;
  }
  else if (uVar1 == 0x5060500) {
    renderTargetInfo_local._4_4_ = 0x8d62;
  }
  else if (uVar1 == 0x8080800) {
    renderTargetInfo_local._4_4_ = 0x8051;
  }
  else if (uVar1 == 0x8080808) {
    renderTargetInfo_local._4_4_ = 0x8058;
  }
  else {
    renderTargetInfo_local._4_4_ = 0;
  }
  return renderTargetInfo_local._4_4_;
}

Assistant:

static deUint32 getCompatibleColorFormat (const tcu::RenderTarget& renderTargetInfo)
{
	const tcu::PixelFormat& pxFmt = renderTargetInfo.getPixelFormat();
	DE_ASSERT(de::inBounds(pxFmt.redBits,	0, 0xff) &&
			  de::inBounds(pxFmt.greenBits,	0, 0xff) &&
			  de::inBounds(pxFmt.blueBits,	0, 0xff) &&
			  de::inBounds(pxFmt.alphaBits,	0, 0xff));

#define PACK_FMT(R, G, B, A) (((R) << 24) | ((G) << 16) | ((B) << 8) | (A))

	// \note [pyry] This may not hold true on some implementations - best effort guess only.
	switch (PACK_FMT(pxFmt.redBits, pxFmt.greenBits, pxFmt.blueBits, pxFmt.alphaBits))
	{
		case PACK_FMT(8,8,8,8):		return GL_RGBA8;
		case PACK_FMT(8,8,8,0):		return GL_RGB8;
		case PACK_FMT(4,4,4,4):		return GL_RGBA4;
		case PACK_FMT(5,5,5,1):		return GL_RGB5_A1;
		case PACK_FMT(5,6,5,0):		return GL_RGB565;
		default:					return GL_NONE;
	}

#undef PACK_FMT
}